

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O3

MPP_RET jpegd_init(void *ctx,ParserCfg *parser_cfg)

{
  MppDecHwCap *pMVar1;
  MppBufSlots slots;
  void *pvVar2;
  char *pcVar3;
  undefined4 uVar4;
  
  pMVar1 = parser_cfg->hw_info;
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_init");
  }
  if ((ctx == (void *)0x0) &&
     (ctx = mpp_osal_calloc("jpegd_init",0x70), (undefined8 *)ctx == (undefined8 *)0x0)) {
    _mpp_log_l(2,"jpegd_parser","NULL pointer","jpegd_init");
    return MPP_ERR_NULL_PTR;
  }
  uVar4 = 0;
  mpp_env_get_u32("jpegd_debug",&jpegd_debug,0);
  *(undefined4 *)((long)ctx + 0x4c) = 0;
  if ((pMVar1 == (MppDecHwCap *)0x0) || ((pMVar1->field_0x7 & 1) == 0)) {
    uVar4 = 1;
  }
  *(undefined4 *)((long)ctx + 0x48) = uVar4;
  slots = parser_cfg->frame_slots;
  *(MppBufSlots *)((long)ctx + 8) = slots;
  *(MppBufSlots *)ctx = parser_cfg->packet_slots;
  *(undefined4 *)((long)ctx + 0x10) = 0xffffffff;
  mpp_buf_slot_setup(slots,1);
  pvVar2 = mpp_osal_calloc("jpegd_init",0x80000);
  *(void **)((long)ctx + 0x18) = pvVar2;
  if (pvVar2 == (void *)0x0) {
    pcVar3 = "no memory!";
  }
  else {
    *(undefined4 *)((long)ctx + 0x24) = 0x80000;
    if (*(int *)((long)ctx + 0x48) == 0) {
      *(MppPacket *)((long)ctx + 0x28) = (MppPacket)0x0;
    }
    else {
      mpp_packet_init((MppPacket *)((long)ctx + 0x28),pvVar2,0x80000);
    }
    mpp_frame_init((MppFrame *)((long)ctx + 0x30));
    if (*(long *)((long)ctx + 0x30) != 0) {
      pvVar2 = mpp_osal_calloc("jpegd_init",0x58);
      *(void **)((long)ctx + 0x60) = pvVar2;
      if (pvVar2 == (void *)0x0) {
        pcVar3 = "allocate bit_ctx failed\n";
      }
      else {
        pvVar2 = mpp_osal_calloc("jpegd_init",0x930);
        *(void **)((long)ctx + 0x68) = pvVar2;
        if (pvVar2 != (void *)0x0) {
          memset(pvVar2,0,0x930);
          *(undefined8 *)((long)ctx + 0x38) = 0;
          *(undefined8 *)((long)ctx + 0x40) = 0;
          if (((byte)jpegd_debug & 1) == 0) {
            return MPP_OK;
          }
          _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_init");
          return MPP_OK;
        }
        pcVar3 = "allocate syntax failed\n";
      }
      _mpp_log_l(2,"jpegd_parser",pcVar3,"jpegd_init");
      return MPP_ERR_MALLOC;
    }
    pcVar3 = "Failed to allocate output frame buffer";
  }
  _mpp_log_l(2,"jpegd_parser",pcVar3,"jpegd_init");
  return MPP_ERR_NOMEM;
}

Assistant:

static MPP_RET jpegd_init(void *ctx, ParserCfg *parser_cfg)
{
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    const MppDecHwCap *hw_info = parser_cfg->hw_info;

    jpegd_dbg_func("enter\n");

    if (NULL == JpegCtx) {
        JpegCtx = (JpegdCtx *)mpp_calloc(JpegdCtx, 1);
        if (NULL == JpegCtx) {
            mpp_err_f("NULL pointer");
            return MPP_ERR_NULL_PTR;
        }
    }

    mpp_env_get_u32("jpegd_debug", &jpegd_debug, 0);
    // mpp only support baseline
    JpegCtx->scan_all_marker = 0;

    if (hw_info && hw_info->cap_hw_jpg_fix) {
        /*
         * no need to copy stream when decoding jpeg;
         * just scan parts of markers to reduce CPU's occupancy
         */
        JpegCtx->copy_flag = 0;
    } else {
        // TODO: do not copy if input provides valid fd and virtual ptr
        JpegCtx->copy_flag = 1;
    }

    JpegCtx->frame_slots = parser_cfg->frame_slots;
    JpegCtx->packet_slots = parser_cfg->packet_slots;
    JpegCtx->frame_slot_index = -1;
    mpp_buf_slot_setup(JpegCtx->frame_slots, 1);

    JpegCtx->recv_buffer = mpp_calloc(RK_U8, JPEGD_STREAM_BUFF_SIZE);
    if (NULL == JpegCtx->recv_buffer) {
        mpp_err_f("no memory!");
        return MPP_ERR_NOMEM;
    }
    JpegCtx->bufferSize = JPEGD_STREAM_BUFF_SIZE;
    if (JpegCtx->copy_flag) {
        mpp_packet_init(&JpegCtx->input_packet,
                        JpegCtx->recv_buffer, JPEGD_STREAM_BUFF_SIZE);
    } else {
        JpegCtx->input_packet = NULL;
    }

    mpp_frame_init(&JpegCtx->output_frame);
    if (!JpegCtx->output_frame) {
        mpp_err_f("Failed to allocate output frame buffer");
        return MPP_ERR_NOMEM;
    }

    JpegCtx->bit_ctx = mpp_calloc(BitReadCtx_t, 1);
    if (JpegCtx->bit_ctx == NULL) {
        mpp_err_f("allocate bit_ctx failed\n");
        return MPP_ERR_MALLOC;
    }

    JpegCtx->syntax = mpp_calloc(JpegdSyntax, 1);
    if (JpegCtx->syntax == NULL) {
        mpp_err_f("allocate syntax failed\n");
        return MPP_ERR_MALLOC;
    }
    memset(JpegCtx->syntax, 0, sizeof(JpegdSyntax));

    JpegCtx->pts = 0;
    JpegCtx->eos = 0;
    JpegCtx->input_jpeg_count = 0;

    jpegd_dbg_func("exit\n");
    return MPP_OK;
}